

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  istream *piVar6;
  byte local_38a;
  byte local_372;
  uint8_t local_316 [2];
  uint16_t local_314;
  ushort local_312;
  int iStack_310;
  uint16_t data;
  uint16_t addr_1;
  uint16_t addr;
  int i_1;
  string local_2e8 [39];
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  int local_274;
  undefined4 local_270;
  int i;
  key_type local_268;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_248;
  allocator<char> local_239;
  key_type local_238;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_218;
  byte local_20e;
  byte local_20d;
  ushort local_20c;
  ushort local_20a;
  stringstream local_208 [2];
  bool status;
  bool memoryControl;
  uint16_t start;
  uint16_t pc;
  stringstream a;
  ostream local_1f8 [376];
  undefined1 local_80 [8];
  string action;
  undefined1 local_50 [8];
  CPU cpu;
  SystemMemory m;
  char **argv_local;
  int argc_local;
  
  SystemMemory::SystemMemory((SystemMemory *)&cpu.cycles,0x10000);
  CPU::CPU((CPU *)local_50,(MemoryBus *)&cpu.cycles);
  std::__cxx11::string::string((string *)local_80);
  std::__cxx11::stringstream::stringstream(local_208);
  local_20a = 0;
  local_20c = 0;
  local_20d = 0;
  local_20e = 0;
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar1,&local_239);
  local_218._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&help_abi_cxx11_,&local_238);
  local_248._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&help_abi_cxx11_);
  bVar2 = std::__detail::operator!=(&local_218,&local_248);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  if (bVar2) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,pcVar1,(allocator<char> *)((long)&i + 3));
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&help_abi_cxx11_,&local_268);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
    local_270 = 1;
  }
  else {
    for (local_274 = 0; local_274 < argc; local_274 = local_274 + 1) {
      pcVar1 = argv[local_274];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar1,&local_299);
      bVar2 = std::operator==(&local_298,"--memory-control");
      if (bVar2) {
        local_372 = 1;
      }
      else {
        local_372 = local_20d;
      }
      local_20d = local_372 & 1;
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      pcVar1 = argv[local_274];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,pcVar1,&local_2c1);
      bVar2 = std::operator==(&local_2c0,"--show-status");
      if (bVar2) {
        local_38a = 1;
      }
      else {
        local_38a = local_20e;
      }
      local_20e = local_38a & 1;
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
    }
    poVar5 = std::operator<<(local_1f8,argv[argc + -2]);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,argv[argc + -1]);
    piVar6 = (istream *)std::istream::operator>>((istream *)local_208,std::hex);
    piVar6 = (istream *)std::istream::operator>>(piVar6,&local_20c);
    std::istream::operator>>(piVar6,&local_20a);
    std::__cxx11::stringstream::str();
    poVar5 = std::operator<<((ostream *)&std::cout,local_2e8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2e8);
    CPU::Reset((CPU *)local_50,local_20a);
    pcVar1 = argv[argc + -3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,pcVar1,(allocator<char> *)((long)&addr + 1));
    bVar2 = ReadFile((string *)&i_1,(MemoryBus *)&cpu.cycles,local_20c);
    std::__cxx11::string::~string((string *)&i_1);
    std::allocator<char>::~allocator((allocator<char> *)((long)&addr + 1));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              do {
                if ((local_20e & 1) != 0) {
                  system("clear");
                  CPU::GetStatus((CPU *)local_50);
                }
                bVar2 = CPU::Execute((CPU *)local_50);
                if (bVar2) {
                  poVar5 = std::operator<<((ostream *)&std::cout,"BRK Handled");
                  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                  if ((local_20d & 1) == 0) {
                    local_270 = 0;
                    goto LAB_001041ef;
                  }
                }
              } while ((local_20d & 1) == 0);
              std::operator>>((istream *)&std::cin,(string *)local_80);
              std::istream::get();
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_80,"stack");
              if (!bVar2) break;
              for (iStack_310 = 0; iStack_310 < 0x100; iStack_310 = iStack_310 + 1) {
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::hex);
                bVar3 = SystemMemory::Read((SystemMemory *)&cpu.cycles,(short)iStack_310 + 0x100);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar3);
                std::operator<<(poVar5," ");
              }
              std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>)
              ;
              std::istream::get();
            }
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80,"read");
            if (!bVar2) break;
            piVar6 = (istream *)std::istream::operator>>((istream *)&std::cin,std::hex);
            std::istream::operator>>(piVar6,&local_312);
            std::istream::get();
            poVar5 = std::operator<<((ostream *)&std::cout,"Memory content at 0x");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)local_312);
            poVar5 = std::operator<<(poVar5," = ");
            bVar3 = SystemMemory::Read((SystemMemory *)&cpu.cycles,local_312);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar3);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::istream::get();
          }
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"write");
          if (!bVar2) break;
          piVar6 = (istream *)std::istream::operator>>((istream *)&std::cin,std::hex);
          piVar6 = (istream *)std::istream::operator>>(piVar6,&local_314);
          std::istream::operator>>(piVar6,(ushort *)local_316);
          std::istream::get();
          SystemMemory::Write((SystemMemory *)&cpu.cycles,local_314,local_316[0]);
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"stop");
      } while (!bVar2);
      local_270 = 1;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error: can\'t read file");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_270 = 1;
    }
  }
LAB_001041ef:
  std::__cxx11::stringstream::~stringstream(local_208);
  std::__cxx11::string::~string((string *)local_80);
  SystemMemory::~SystemMemory((SystemMemory *)&cpu.cycles);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    SystemMemory m(1024 * 64);
    CPU cpu(m);
    
    std::string action;
    std::stringstream a;

    uint16_t pc{}, start{};
    bool memoryControl{}, status{};
    
    if(help.find(argv[1]) != help.end())
    {
        std::cout << help.at(argv[1]) << std::endl;
        
        return 0;
    }

    for(int i = 0; i < argc; i++)
    {
        memoryControl = (std::string(argv[i]) == "--memory-control" ? true : memoryControl);
        status = (std::string(argv[i]) == "--show-status" ? true : status);
    }

    a << argv[argc - 2] << " " << argv[argc - 1];
    a >> std::hex >> start >> pc;

    std::cout << a.str() << std::endl;

    cpu.Reset(pc);
    
    if(!ReadFile(argv[argc - 3], m, start))
    {
        std::cout << "Error: can't read file" << std::endl;
        
        return 0;
    }

    while(true)
    {
        if(status)
        {
            system("clear");
            cpu.GetStatus();
        }
        
        if(cpu.Execute())
        {
            std::cout << "BRK Handled" << std::endl;
            
            if(!memoryControl)
                break;
        }

        if(memoryControl)
        {
            (std::cin >> action).get();

            if(action == "stack")
            {
                for(int i = 0; i < 256; i++)
                    std::cout << std::hex << (int)m.Read(0x0100 + i) << " ";
                
                std::cout << std::endl;

                std::cin.get();
            }
            else if(action == "read")
            {
                uint16_t addr;
                
                (std::cin >> std::hex >> addr).get();
                std::cout << "Memory content at 0x" << std::hex << (int)addr << " = " << (int)m.Read(addr) << std::endl;
                
                std::cin.get();
            }
            else if(action == "write")
            {
                uint16_t addr, data;

                (std::cin >> std::hex >> addr >> data).get();
                
                m.Write(addr, static_cast<uint8_t>(data));
            }
            else if(action == "stop")
                return 0;
        }
    } 
}